

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O3

void __thiscall WavingSketch<8U,_1U,_4U>::Init(WavingSketch<8U,_1U,_4U> *this,Data<4U> *item)

{
  uint uVar1;
  ulong in_RAX;
  bool is_empty;
  undefined8 uStack_18;
  
  uVar1 = ((uint)(*(int *)item->str * -0x3361d2af) >> 0x11 | *(int *)item->str * 0x16a88000) *
          0x1b873593 ^ this->seed_choice;
  uVar1 = (uVar1 >> 0x13 | uVar1 << 0xd) * 5 + 0xe6546b64;
  uVar1 = (uVar1 >> 0x10 ^ uVar1 ^ 4) * -0x7a143595;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51cb;
  uStack_18 = in_RAX & 0xffffffffffffff;
  Bucket::Insert(this->buckets + (ulong)(uVar1 >> 0x10 ^ uVar1) % (ulong)this->BUCKET_NUM,item,
                 this->seed_s,this->seed_incast,(bool *)((long)&uStack_18 + 7));
  this->cnt = this->cnt + (uint)uStack_18._7_1_;
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item) {
		uint32_t bucket_pos = item.Hash(seed_choice) % BUCKET_NUM;
		bool is_empty = 0;
		buckets[bucket_pos].Insert(item, seed_s, seed_incast, is_empty);
		cnt += is_empty;
	}